

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incppect.cpp
# Opt level: O2

thread __thiscall Incppect<false>::runAsync(Incppect<false> *this,Parameters *parameters)

{
  Parameters *in_RDX;
  anon_class_152_2_9f0aae65_for__M_head_impl local_a8;
  
  local_a8.this = (Incppect<false> *)parameters;
  Parameters::Parameters(&local_a8.parameters,in_RDX);
  std::thread::thread<Incppect<false>::runAsync(Incppect<false>::Parameters)::_lambda()_1_,,void>
            ((thread *)this,&local_a8);
  Parameters::~Parameters(&local_a8.parameters);
  return (thread)(id)this;
}

Assistant:

std::thread Incppect<SSL>::runAsync(Parameters parameters) {
    std::thread worker([this, parameters]() { this->run(parameters); });
    return worker;
}